

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O3

void CBlockFileInfo::SerializationOps<DataStream,CBlockFileInfo_const,ActionSerialize>
               (uint *obj,DataStream *s)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteVarInt<DataStream,(VarIntMode)0,unsigned_int>(s,*obj);
  WriteVarInt<DataStream,(VarIntMode)0,unsigned_int>(s,obj[1]);
  WriteVarInt<DataStream,(VarIntMode)0,unsigned_int>(s,obj[2]);
  WriteVarInt<DataStream,(VarIntMode)0,unsigned_int>(s,obj[3]);
  WriteVarInt<DataStream,(VarIntMode)0,unsigned_int>(s,obj[4]);
  WriteVarInt<DataStream,(VarIntMode)0,unsigned_long>(s,*(unsigned_long *)(obj + 6));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    WriteVarInt<DataStream,(VarIntMode)0,unsigned_long>(s,*(unsigned_long *)(obj + 8));
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CBlockFileInfo, obj)
    {
        READWRITE(VARINT(obj.nBlocks));
        READWRITE(VARINT(obj.nSize));
        READWRITE(VARINT(obj.nUndoSize));
        READWRITE(VARINT(obj.nHeightFirst));
        READWRITE(VARINT(obj.nHeightLast));
        READWRITE(VARINT(obj.nTimeFirst));
        READWRITE(VARINT(obj.nTimeLast));
    }